

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O0

void Imf_3_4::Xdr::write<Imf_3_4::CharPtrIO,char*>(char **out,float v)

{
  undefined4 in_XMM0_Da;
  uchar b [4];
  anon_union_4_2_947300a4 u;
  undefined4 in_stack_ffffffffffffffe8;
  
  writeUnsignedChars<Imf_3_4::CharPtrIO,char*>
            ((char **)CONCAT44(in_XMM0_Da,in_XMM0_Da),
             (uchar *)CONCAT17((char)((uint)in_XMM0_Da >> 0x18),
                               CONCAT16((char)((uint)in_XMM0_Da >> 0x10),
                                        CONCAT15((char)((uint)in_XMM0_Da >> 8),
                                                 CONCAT14((char)in_XMM0_Da,in_stack_ffffffffffffffe8
                                                         )))),0);
  return;
}

Assistant:

void
write (T& out, float v)
{
    union
    {
        unsigned int i;
        float        f;
    } u;
    u.f = v;

    unsigned char b[4];

    b[0] = (unsigned char) (u.i);
    b[1] = (unsigned char) (u.i >> 8);
    b[2] = (unsigned char) (u.i >> 16);
    b[3] = (unsigned char) (u.i >> 24);

    writeUnsignedChars<S> (out, b, 4);
}